

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_type(lys_ypr_ctx_conflict *pctx,lysp_type *type)

{
  uint16_t *puVar1;
  lysp_restr *plVar2;
  lysp_type *plVar3;
  ulong in_RAX;
  lysp_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  char *pcVar6;
  ulong uVar7;
  int8_t *flag_00;
  char *pcVar8;
  lysp_ext_instance *flag_01;
  long lVar9;
  uint64_t u;
  lysp_ext_instance *plVar10;
  lysp_ext_instance *plVar11;
  ulong uVar12;
  int8_t flag;
  undefined1 auStack_38 [8];
  
  auStack_38 = (undefined1  [8])(in_RAX & 0xffffffffffffff);
  if (type != (lysp_type *)0x0 && pctx != (lys_ypr_ctx_conflict *)0x0) {
    plVar10 = (lysp_ext_instance *)0x0;
    flag_01 = (lysp_ext_instance *)0x0;
    ypr_open(pctx,"type","name",type->name,'\0');
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    plVar11 = type->exts;
    plVar5 = plVar11;
    while( true ) {
      if (plVar11 == (lysp_ext_instance *)0x0) {
        plVar4 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar11[-1].exts;
      }
      if (plVar4 <= plVar10) break;
      flag_01 = (lysp_ext_instance *)(auStack_38 + 7);
      yprp_extension_instance(pctx,LY_STMT_TYPE,'\0',plVar5,(int8_t *)(auStack_38 + 7));
      plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
      plVar5 = plVar5 + 1;
    }
    if (((((type->range != (lysp_restr *)0x0) || (type->length != (lysp_restr *)0x0)) ||
         (type->patterns != (lysp_restr *)0x0)) ||
        ((type->bits != (lysp_type_enum *)0x0 || (type->enums != (lysp_type_enum *)0x0)))) &&
       (auStack_38[7] == '\0')) {
      auStack_38[7] = 1;
      ly_print_((pctx->field_0).field_0.out,">\n");
    }
    yprp_restr(pctx,type->range,LY_STMT_RANGE,"value",(int8_t *)flag_01);
    flag_00 = "value";
    yprp_restr(pctx,type->length,LY_STMT_LENGTH,"value",(int8_t *)flag_01);
    lVar9 = 0;
    plVar11 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar2 = type->patterns;
      if (plVar2 == (lysp_restr *)0x0) {
        plVar5 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar5 = plVar2[-1].exts;
      }
      if (plVar5 <= plVar11) break;
      flag_00 = "value";
      yprp_restr(pctx,(lysp_restr *)((long)&(plVar2->arg).str + lVar9),LY_STMT_PATTERN,"value",
                 (int8_t *)flag_01);
      plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
      lVar9 = lVar9 + 0x40;
    }
    yprp_enum(pctx,type->bits,LY_TYPE_BITS,flag_00);
    yprp_enum(pctx,type->enums,LY_TYPE_ENUM,flag_00);
    if (type->path != (lyxp_expr *)0x0) {
      if (auStack_38[7] == '\0') {
        auStack_38[7] = 1;
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      flag_01 = type->exts;
      ypr_substmt(pctx,LY_STMT_PATH,'\0',type->path->expr,flag_01);
    }
    if ((type->flags & 0x200) != 0) {
      if (auStack_38[7] == '\0') {
        auStack_38[7] = 1;
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      pcVar8 = "true";
      if (type->require_instance == '\0') {
        pcVar8 = "false";
      }
      flag_01 = type->exts;
      ypr_substmt(pctx,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar8,flag_01);
    }
    if ((type->flags & 8) != 0) {
      if (auStack_38[7] == '\0') {
        auStack_38[7] = 1;
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      ypr_unsigned(pctx,LY_STMT_FRACTION_DIGITS,(uint8_t)type->exts,
                   (void *)(ulong)type->fraction_digits,(unsigned_long)flag_01);
    }
    pcVar8 = (char *)0x0;
    while( true ) {
      if (type->bases == (char **)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = type->bases[-1];
      }
      if (pcVar6 <= pcVar8) break;
      if (auStack_38[7] == '\0') {
        auStack_38[7] = 1;
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)pcVar8,type->bases[(long)pcVar8],type->exts);
      pcVar8 = pcVar8 + 1;
    }
    lVar9 = 0;
    uVar12 = 0;
    while( true ) {
      plVar3 = type->types;
      if (plVar3 == (lysp_type *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7._0_1_ = plVar3[-1].fraction_digits;
        uVar7._1_1_ = plVar3[-1].require_instance;
        uVar7._2_2_ = plVar3[-1].flags;
        uVar7._4_4_ = *(undefined4 *)&plVar3[-1].field_0x64;
      }
      if (uVar7 <= uVar12) break;
      if (auStack_38[7] == '\0') {
        auStack_38[7] = 1;
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      yprp_type(pctx,(lysp_type *)((long)&type->types->name + lVar9));
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x68;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,"type",auStack_38[7]);
  }
  return;
}

Assistant:

static void
yprp_type(struct lys_ypr_ctx *pctx, const struct lysp_type *type)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t flag = 0;

    if (!pctx || !type) {
        return;
    }

    ypr_open(pctx, "type", "name", type->name, flag);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_TYPE, 0, type->exts, &flag);

    if (type->range || type->length || type->patterns || type->bits || type->enums) {
        ypr_close_parent(pctx, &flag);
    }
    yprp_restr(pctx, type->range, LY_STMT_RANGE, "value", &flag);
    yprp_restr(pctx, type->length, LY_STMT_LENGTH, "value", &flag);
    LY_ARRAY_FOR(type->patterns, u) {
        yprp_restr(pctx, &type->patterns[u], LY_STMT_PATTERN, "value", &flag);
    }
    yprp_enum(pctx, type->bits, LY_TYPE_BITS, &flag);
    yprp_enum(pctx, type->enums, LY_TYPE_ENUM, &flag);

    if (type->path) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_PATH, 0, type->path->expr, type->exts);
    }
    if (type->flags & LYS_SET_REQINST) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, type->require_instance ? "true" : "false", type->exts);
    }
    if (type->flags & LYS_SET_FRDIGITS) {
        ypr_close_parent(pctx, &flag);
        ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, type->exts, type->fraction_digits);
    }
    LY_ARRAY_FOR(type->bases, u) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_BASE, u, type->bases[u], type->exts);
    }
    LY_ARRAY_FOR(type->types, u) {
        ypr_close_parent(pctx, &flag);
        yprp_type(pctx, &type->types[u]);
    }

    LEVEL--;
    ypr_close(pctx, "type", flag);
}